

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor::CheckTypeAndMergeFrom
          (BayesianProbitRegressor *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *pBVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__BayesianProbitRegressor_004bd7f0) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::BayesianProbitRegressor *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((BayesianProbitRegressor *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x50c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
            (&(this->features_).super_RepeatedPtrFieldBase,(RepeatedPtrFieldBase *)(from + 1));
  uVar4 = from[2]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->regressioninputfeaturename_,uVar4,puVar3)
    ;
  }
  uVar4 = (ulong)from[3]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->optimisminputfeaturename_,uVar4,puVar3);
  }
  uVar4 = from[3]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingscaleinputfeaturename_,uVar4,puVar3);
  }
  uVar4 = (ulong)from[4]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingtruncationinputfeaturename_,uVar4,puVar3);
  }
  uVar4 = from[4]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->meanoutputfeaturename_,uVar4,puVar3);
  }
  uVar4 = (ulong)from[5]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->varianceoutputfeaturename_,uVar4,puVar3);
  }
  uVar4 = from[5]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->pessimisticprobabilityoutputfeaturename_,uVar4,puVar3);
  }
  uVar4 = (ulong)from[6]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->sampledprobabilityoutputfeaturename_,uVar4,puVar3);
  }
  if ((from != (MessageLite *)_BayesianProbitRegressor_default_instance_) &&
     (from[6]._internal_metadata_.ptr_ != 0)) {
    if (this->bias_ == (BayesianProbitRegressor_Gaussian *)0x0) {
      uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pBVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::BayesianProbitRegressor_Gaussian>(arena);
      this->bias_ = pBVar2;
    }
    from_00 = (undefined1 *)from[6]._internal_metadata_.ptr_;
    if ((BayesianProbitRegressor_Gaussian *)from_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      from_00 = _BayesianProbitRegressor_Gaussian_default_instance_;
    }
    BayesianProbitRegressor_Gaussian::MergeFrom
              (this->bias_,(BayesianProbitRegressor_Gaussian *)from_00);
  }
  if (*(uint32_t *)&from[7]._vptr_MessageLite != 0) {
    this->numberoffeatures_ = *(uint32_t *)&from[7]._vptr_MessageLite;
  }
  uVar4 = (from->_internal_metadata_).ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}